

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3EvalPhraseMergeToken(Fts3Table *pTab,Fts3Phrase *p,int iToken,char *pList,int nList)

{
  byte *pbVar1;
  u8 uVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  byte *pbVar9;
  ulong uVar10;
  undefined1 *puVar11;
  undefined1 *puVar12;
  byte *pBuf;
  undefined1 *puVar13;
  int iVar14;
  char *pEnd_1;
  byte *pbVar15;
  int iVar16;
  int iVar17;
  undefined1 *puVar18;
  long in_FS_OFFSET;
  u64 iVal;
  int local_8c;
  byte *local_58;
  byte *local_50;
  byte *local_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pList == (char *)0x0) {
    sqlite3_free((p->doclist).aAll);
    (p->doclist).aAll = (char *)0x0;
    (p->doclist).nAll = 0;
  }
  else {
    iVar7 = p->iDoclistToken;
    if (iVar7 < 0) {
      (p->doclist).aAll = pList;
      (p->doclist).nAll = nList;
    }
    else {
      pbVar9 = (byte *)(p->doclist).aAll;
      if (pbVar9 != (byte *)0x0) {
        iVar17 = (p->doclist).nAll;
        local_8c = iVar7 - iToken;
        pBuf = pbVar9;
        iVar14 = nList;
        if (iVar7 < iToken) {
          local_8c = iToken - iVar7;
          pBuf = (byte *)pList;
          pList = (char *)pbVar9;
          iVar14 = iVar17;
          iVar17 = nList;
        }
        uVar2 = pTab->bDescIdx;
        pbVar9 = pBuf;
        if (uVar2 == '\0') {
LAB_001cb311:
          local_58 = pbVar9;
          if (iVar14 < 1) {
            pbVar15 = (byte *)0x0;
            puVar13 = (undefined1 *)0x0;
          }
          else {
            local_40 = &DAT_aaaaaaaaaaaaaaaa;
            iVar7 = sqlite3Fts3GetVarintU(pList,(sqlite_uint64 *)&local_40);
            pbVar15 = (byte *)pList + iVar7;
            puVar13 = local_40;
          }
          iVar16 = (int)pbVar9;
          iVar7 = iVar16;
          local_48 = pbVar15;
          if (0 < iVar17) {
            local_40 = &DAT_aaaaaaaaaaaaaaaa;
            iVar8 = sqlite3Fts3GetVarintU((char *)pBuf,(sqlite_uint64 *)&local_40);
            local_50 = pBuf + iVar8;
            if (pbVar15 != (byte *)0x0) {
              bVar4 = false;
              puVar18 = (undefined1 *)0x0;
              puVar12 = local_40;
              do {
                pbVar1 = local_58;
                iVar7 = -(uint)(puVar13 != puVar12);
                if ((long)puVar12 < (long)puVar13) {
                  iVar7 = 1;
                }
                iVar8 = -iVar7;
                if (uVar2 == '\0') {
                  iVar8 = iVar7;
                }
                if (iVar8 == 0) {
                  uVar10 = (long)puVar18 - (long)puVar13;
                  if (!bVar4) {
                    uVar10 = (long)puVar13 - (long)puVar18;
                  }
                  if (uVar2 == '\0') {
                    uVar10 = (long)puVar13 - (long)puVar18;
                  }
                  do {
                    pbVar15 = local_58;
                    bVar5 = (byte)uVar10;
                    *pbVar15 = bVar5 | 0x80;
                    local_58 = pbVar15 + 1;
                    bVar3 = 0x7f < uVar10;
                    uVar10 = uVar10 >> 7;
                  } while (bVar3);
                  *pbVar15 = bVar5;
                  iVar7 = fts3PoslistPhraseMerge
                                    ((char **)&local_58,local_8c,0,1,(char **)&local_48,
                                     (char **)&local_50);
                  pbVar15 = local_48;
                  puVar11 = puVar13;
                  bVar3 = true;
                  if (iVar7 == 0) {
                    puVar11 = puVar18;
                    local_58 = pbVar1;
                    bVar3 = bVar4;
                  }
                  puVar18 = puVar11;
                  if (local_48 < (byte *)pList + iVar14) {
                    local_40 = &DAT_aaaaaaaaaaaaaaaa;
                    iVar7 = sqlite3Fts3GetVarintU((char *)local_48,(sqlite_uint64 *)&local_40);
                    pbVar15 = pbVar15 + iVar7;
                    puVar11 = (undefined1 *)-(long)local_40;
                    if (uVar2 == '\0') {
                      puVar11 = local_40;
                    }
                    puVar13 = puVar13 + (long)puVar11;
                  }
                  else {
                    pbVar15 = (byte *)0x0;
                  }
                  pbVar1 = local_50;
                  local_48 = pbVar15;
                  if (pBuf + iVar17 <= local_50) goto LAB_001cb643;
                  local_40 = &DAT_aaaaaaaaaaaaaaaa;
                  iVar7 = sqlite3Fts3GetVarintU((char *)local_50,(sqlite_uint64 *)&local_40);
                  local_50 = pbVar1 + iVar7;
                  puVar11 = (undefined1 *)-(long)local_40;
                  if (uVar2 == '\0') {
                    puVar11 = local_40;
                  }
                  puVar12 = puVar12 + (long)puVar11;
                  bVar4 = bVar3;
                }
                else if (iVar8 < 0) {
                  bVar5 = *pbVar15;
                  if (*pbVar15 != 0) {
                    do {
                      pbVar1 = pbVar15 + 1;
                      pbVar15 = pbVar15 + 1;
                      bVar6 = bVar5 & 0x80;
                      bVar5 = *pbVar1;
                    } while (bVar6 != 0 || *pbVar1 != 0);
                  }
                  local_48 = pbVar15 + 1;
                  if ((byte *)pList + iVar14 <= local_48) goto LAB_001cb643;
                  local_40 = &DAT_aaaaaaaaaaaaaaaa;
                  iVar7 = sqlite3Fts3GetVarintU((char *)local_48,(sqlite_uint64 *)&local_40);
                  pbVar15 = local_48 + iVar7;
                  puVar11 = (undefined1 *)-(long)local_40;
                  if (uVar2 == '\0') {
                    puVar11 = local_40;
                  }
                  puVar13 = puVar13 + (long)puVar11;
                  local_48 = pbVar15;
                }
                else {
                  bVar5 = *local_50;
                  if (*local_50 != 0) {
                    do {
                      pbVar15 = local_50 + 1;
                      local_50 = local_50 + 1;
                      bVar6 = bVar5 & 0x80;
                      bVar5 = *pbVar15;
                    } while (bVar6 != 0 || *pbVar15 != 0);
                  }
                  local_50 = local_50 + 1;
                  if (pBuf + iVar17 <= local_50) goto LAB_001cb643;
                  local_40 = &DAT_aaaaaaaaaaaaaaaa;
                  iVar7 = sqlite3Fts3GetVarintU((char *)local_50,(sqlite_uint64 *)&local_40);
                  local_50 = local_50 + iVar7;
                  puVar11 = (undefined1 *)-(long)local_40;
                  if (uVar2 == '\0') {
                    puVar11 = local_40;
                  }
                  puVar12 = puVar12 + (long)puVar11;
                  pbVar15 = local_48;
                }
                if ((pbVar15 == (byte *)0x0) || (local_50 == (byte *)0x0)) goto LAB_001cb643;
              } while( true );
            }
          }
          goto LAB_001cb652;
        }
        iVar7 = sqlite3_initialize();
        iVar16 = 7;
        if ((iVar7 == 0) &&
           (pbVar9 = (byte *)sqlite3Malloc((long)iVar17 + 10), pbVar9 != (byte *)0x0))
        goto LAB_001cb311;
        goto LAB_001cb675;
      }
      sqlite3_free(pList);
    }
  }
  iVar16 = 0;
  goto LAB_001cb684;
LAB_001cb643:
  iVar7 = (int)local_58;
LAB_001cb652:
  iVar17 = iVar7 - iVar16;
  iVar16 = 0;
  if (uVar2 != '\0') {
    sqlite3_free(pBuf);
    pBuf = pbVar9;
  }
LAB_001cb675:
  sqlite3_free(pList);
  (p->doclist).aAll = (char *)pBuf;
  (p->doclist).nAll = iVar17;
LAB_001cb684:
  if (p->iDoclistToken < iToken) {
    p->iDoclistToken = iToken;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar16;
}

Assistant:

static int fts3EvalPhraseMergeToken(
  Fts3Table *pTab,                /* FTS Table pointer */
  Fts3Phrase *p,                  /* Phrase to merge pList/nList into */
  int iToken,                     /* Token pList/nList corresponds to */
  char *pList,                    /* Pointer to doclist */
  int nList                       /* Number of bytes in pList */
){
  int rc = SQLITE_OK;
  assert( iToken!=p->iDoclistToken );

  if( pList==0 ){
    sqlite3_free(p->doclist.aAll);
    p->doclist.aAll = 0;
    p->doclist.nAll = 0;
  }

  else if( p->iDoclistToken<0 ){
    p->doclist.aAll = pList;
    p->doclist.nAll = nList;
  }

  else if( p->doclist.aAll==0 ){
    sqlite3_free(pList);
  }

  else {
    char *pLeft;
    char *pRight;
    int nLeft;
    int nRight;
    int nDiff;

    if( p->iDoclistToken<iToken ){
      pLeft = p->doclist.aAll;
      nLeft = p->doclist.nAll;
      pRight = pList;
      nRight = nList;
      nDiff = iToken - p->iDoclistToken;
    }else{
      pRight = p->doclist.aAll;
      nRight = p->doclist.nAll;
      pLeft = pList;
      nLeft = nList;
      nDiff = p->iDoclistToken - iToken;
    }

    rc = fts3DoclistPhraseMerge(
        pTab->bDescIdx, nDiff, pLeft, nLeft, &pRight, &nRight
    );
    sqlite3_free(pLeft);
    p->doclist.aAll = pRight;
    p->doclist.nAll = nRight;
  }

  if( iToken>p->iDoclistToken ) p->iDoclistToken = iToken;
  return rc;
}